

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rd.c
# Opt level: O3

int av1_get_deltaq_offset(aom_bit_depth_t bit_depth,int qindex,double beta)

{
  int16_t iVar1;
  int iVar2;
  uint uVar3;
  uint uVar4;
  int iVar5;
  int iVar6;
  double dVar7;
  
  iVar5 = 0;
  iVar1 = av1_dc_quant_QTX(qindex,0,bit_depth);
  iVar2 = (int)iVar1;
  if (beta < 0.0) {
    dVar7 = sqrt(beta);
  }
  else {
    dVar7 = SQRT(beta);
  }
  dVar7 = rint((double)iVar2 / dVar7);
  iVar6 = (int)dVar7;
  if (iVar6 != iVar2) {
    uVar3 = qindex;
    if (iVar6 < iVar2) {
      uVar4 = qindex;
      if (0 < qindex) {
        do {
          uVar3 = uVar4 - 1;
          iVar1 = av1_dc_quant_QTX(uVar3,0,bit_depth);
          if (uVar4 < 2) break;
          uVar4 = uVar3;
        } while (iVar6 < iVar1);
      }
    }
    else {
      uVar4 = qindex;
      if (qindex < 0xff) {
        do {
          uVar3 = uVar4 + 1;
          iVar1 = av1_dc_quant_QTX(uVar3,0,bit_depth);
          if (0xfd < (int)uVar4) break;
          uVar4 = uVar3;
        } while (iVar1 < iVar6);
      }
    }
    iVar5 = uVar3 - qindex;
  }
  return iVar5;
}

Assistant:

int av1_get_deltaq_offset(aom_bit_depth_t bit_depth, int qindex, double beta) {
  assert(beta > 0.0);
  int q = av1_dc_quant_QTX(qindex, 0, bit_depth);
  int newq = (int)rint(q / sqrt(beta));
  int orig_qindex = qindex;
  if (newq == q) {
    return 0;
  }
  if (newq < q) {
    while (qindex > 0) {
      qindex--;
      q = av1_dc_quant_QTX(qindex, 0, bit_depth);
      if (newq >= q) {
        break;
      }
    }
  } else {
    while (qindex < MAXQ) {
      qindex++;
      q = av1_dc_quant_QTX(qindex, 0, bit_depth);
      if (newq <= q) {
        break;
      }
    }
  }
  return qindex - orig_qindex;
}